

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::AddSucc(BasicBlock *this,FlowEdge *edge,FlowGraph *graph)

{
  RealCount *pRVar1;
  Type pSVar2;
  
  pSVar2 = (Type)new<Memory::ArenaAllocator>(0x10,&graph->alloc->super_ArenaAllocator,0x366bee);
  pSVar2[1].next = (Type)edge;
  pSVar2->next = (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar2;
  pRVar1 = &(this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void
BasicBlock::AddSucc(FlowEdge * edge, FlowGraph * graph)
{
    this->succList.Prepend(graph->alloc, edge);
}